

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::FeatureDescription::MergeFrom
          (FeatureDescription *this,FeatureDescription *from)

{
  void *pvVar1;
  ArenaStringPtr AVar2;
  LogMessage *other;
  FeatureType *this_00;
  FeatureType *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/Model.pb.cc"
               ,0x4d0);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  AVar2.ptr_ = (from->name_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->shortdescription_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->shortdescription_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  if ((from != (FeatureDescription *)&_FeatureDescription_default_instance_) &&
     (from->type_ != (FeatureType *)0x0)) {
    this_00 = mutable_type(this);
    from_00 = from->type_;
    if (from_00 == (FeatureType *)0x0) {
      from_00 = (FeatureType *)&_FeatureType_default_instance_;
    }
    FeatureType::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void FeatureDescription::MergeFrom(const FeatureDescription& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.FeatureDescription)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.name().size() > 0) {

    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.shortdescription().size() > 0) {

    shortdescription_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.shortdescription_);
  }
  if (from.has_type()) {
    mutable_type()->::CoreML::Specification::FeatureType::MergeFrom(from.type());
  }
}